

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

CollSeq * sqlite3LocateCollSeq(Parse *pParse,char *zName)

{
  byte bVar1;
  u8 enc;
  sqlite3 *db;
  CollSeq *pCVar2;
  
  db = pParse->db;
  bVar1 = (db->init).busy;
  enc = db->enc;
  pCVar2 = sqlite3FindCollSeq(db,enc,zName,(uint)bVar1);
  if ((bVar1 == 0) &&
     ((pCVar2 == (CollSeq *)0x0 ||
      (pCVar2->xCmp == (_func_int_void_ptr_int_void_ptr_int_void_ptr *)0x0)))) {
    pCVar2 = sqlite3GetCollSeq(pParse,enc,pCVar2,zName);
    return pCVar2;
  }
  return pCVar2;
}

Assistant:

SQLITE_PRIVATE CollSeq *sqlite3LocateCollSeq(Parse *pParse, const char *zName){
  sqlite3 *db = pParse->db;
  u8 enc = ENC(db);
  u8 initbusy = db->init.busy;
  CollSeq *pColl;

  pColl = sqlite3FindCollSeq(db, enc, zName, initbusy);
  if( !initbusy && (!pColl || !pColl->xCmp) ){
    pColl = sqlite3GetCollSeq(pParse, enc, pColl, zName);
  }

  return pColl;
}